

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_io.c
# Opt level: O0

int io_file_readline(lua_State *L,FILE *fp,MSize chop)

{
  TValue *pTVar1;
  char *str;
  char *pcVar2;
  size_t sVar3;
  GCstr *pGVar4;
  char *buf;
  MSize ok;
  MSize n;
  MSize m;
  MSize chop_local;
  FILE *fp_local;
  lua_State *L_local;
  
  ok = 0x2000;
  buf._4_4_ = 0;
  buf._0_4_ = 0;
  do {
    str = lj_buf_tmp(L,ok);
    pcVar2 = fgets(str + buf._4_4_,ok - buf._4_4_,(FILE *)fp);
    if (pcVar2 == (char *)0x0) {
LAB_001aece9:
      pTVar1 = L->top;
      L->top = pTVar1 + 1;
      pGVar4 = lj_str_new(L,str,(ulong)buf._4_4_);
      pTVar1->u64 = (ulong)pGVar4 | 0xfffd800000000000;
      if (*(ulong *)((L->glref).ptr64 + 0x18) <= *(ulong *)((L->glref).ptr64 + 0x10)) {
        lj_gc_step(L);
      }
      return (uint)buf;
    }
    sVar3 = strlen(str + buf._4_4_);
    buf._4_4_ = (int)sVar3 + buf._4_4_;
    buf._0_4_ = buf._4_4_ | (uint)buf;
    if ((buf._4_4_ != 0) && (str[buf._4_4_ - 1] == '\n')) {
      buf._4_4_ = buf._4_4_ - chop;
      goto LAB_001aece9;
    }
    if (ok - 0x40 <= buf._4_4_) {
      ok = ok * 2;
    }
  } while( true );
}

Assistant:

static int io_file_readline(lua_State *L, FILE *fp, MSize chop)
{
  MSize m = LUAL_BUFFERSIZE, n = 0, ok = 0;
  char *buf;
  for (;;) {
    buf = lj_buf_tmp(L, m);
    if (fgets(buf+n, m-n, fp) == NULL) break;
    n += (MSize)strlen(buf+n);
    ok |= n;
    if (n && buf[n-1] == '\n') { n -= chop; break; }
    if (n >= m - 64) m += m;
  }
  setstrV(L, L->top++, lj_str_new(L, buf, (size_t)n));
  lj_gc_check(L);
  return (int)ok;
}